

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.h
# Opt level: O1

void __thiscall node::SnapshotMetadata::Unserialize<AutoFile>(SnapshotMetadata *this,AutoFile *s)

{
  _Rb_tree_header *p_Var1;
  optional<ChainType> oVar2;
  char *pcVar3;
  string *psVar4;
  uint uVar5;
  size_t in_RCX;
  size_t __nbytes;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  bool bVar8;
  uint16_t version;
  MessageStartChars message;
  array<unsigned_char,_5UL> snapshot_magic;
  string node_network_string;
  uint16_t obj;
  undefined2 local_94;
  MessageStartChars local_91;
  uint local_8d;
  byte local_89;
  string local_88;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(s,(int)&local_8d,(void *)0x5,in_RCX);
  uVar5 = local_89 ^ 0xff | local_8d ^ 0x6f787475;
  if (uVar5 == 0) {
    AutoFile::read(s,(int)&local_48,(void *)0x2,(ulong)uVar5);
    __nbytes = (size_t)(ushort)local_48._M_dataplus._M_p._0_2_;
    local_94 = local_48._M_dataplus._M_p._0_2_;
    p_Var1 = &(this->m_supported_versions)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = (this->m_supported_versions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[bVar8]) {
      bVar8 = (ushort)(short)p_Var7[1]._M_color < (ushort)local_48._M_dataplus._M_p._0_2_;
      if (!bVar8) {
        p_Var6 = p_Var7;
      }
    }
    p_Var7 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var7 = p_Var6, (ushort)local_48._M_dataplus._M_p._0_2_ < (ushort)(short)p_Var6[1]._M_color
       )) {
      p_Var7 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      psVar4 = (string *)__cxa_allocate_exception(0x20);
      tinyformat::format<unsigned_short>
                (&local_48,"Version of snapshot %s does not match any of the supported versions.",
                 &local_94);
      std::ios_base::failure[abi:cxx11]::failure(psVar4);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(psVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
    else {
      AutoFile::read(s,(int)&local_91,(void *)0x4,__nbytes);
      if (local_91._M_elems == *&(this->m_network_magic)._M_elems) {
        AutoFile::read(s,(int)this + 0x34,(void *)0x20,__nbytes);
        AutoFile::read(s,(int)&local_48,&DAT_00000008,__nbytes);
        this->m_coins_count =
             CONCAT44(local_48._M_dataplus._M_p._4_4_,
                      CONCAT22(local_48._M_dataplus._M_p._2_2_,local_48._M_dataplus._M_p._0_2_));
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          return;
        }
      }
      else {
        oVar2 = GetNetworkForMagic(&local_91);
        if (((ulong)oVar2.super__Optional_base<ChainType,_true,_true>._M_payload.
                    super__Optional_payload_base<ChainType> >> 0x20 & 1) == 0) {
          pcVar3 = (char *)__cxa_allocate_exception(0x20);
          local_48._M_string_length = std::iostream_category();
          local_48._M_dataplus._M_p._0_2_ = _S_black;
          local_48._M_dataplus._M_p._2_2_ = 0;
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar3,(error_code *)
                            "This snapshot has been created for an unrecognized network. This could be a custom signet, a new testnet or possibly caused by data corruption."
                    );
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
        else {
          ChainTypeToString_abi_cxx11_
                    (&local_48,
                     oVar2.super__Optional_base<ChainType,_true,_true>._M_payload.
                     super__Optional_payload_base<ChainType>._M_payload);
          oVar2 = GetNetworkForMagic(&this->m_network_magic);
          if (((ulong)oVar2.super__Optional_base<ChainType,_true,_true>._M_payload.
                      super__Optional_payload_base<ChainType> & 0x100000000) == 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            ChainTypeToString_abi_cxx11_
                      (&local_68,
                       oVar2.super__Optional_base<ChainType,_true,_true>._M_payload.
                       super__Optional_payload_base<ChainType>._M_payload);
            psVar4 = (string *)__cxa_allocate_exception(0x20);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_88,
                       (tinyformat *)
                       "The network of the snapshot (%s) does not match the network of this node (%s)."
                       ,(char *)&local_48,&local_68,in_R8);
            std::ios_base::failure[abi:cxx11]::failure(psVar4);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              __cxa_throw(psVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
          }
        }
      }
    }
  }
  else {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    local_48._M_string_length = std::iostream_category();
    local_48._M_dataplus._M_p._0_2_ = _S_black;
    local_48._M_dataplus._M_p._2_2_ = 0;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)
                      "Invalid UTXO set snapshot magic bytes. Please check if this is indeed a snapshot file or if you are using an outdated snapshot format."
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Read the snapshot magic bytes
        std::array<uint8_t, SNAPSHOT_MAGIC_BYTES.size()> snapshot_magic;
        s >> snapshot_magic;
        if (snapshot_magic != SNAPSHOT_MAGIC_BYTES) {
            throw std::ios_base::failure("Invalid UTXO set snapshot magic bytes. Please check if this is indeed a snapshot file or if you are using an outdated snapshot format.");
        }

        // Read the version
        uint16_t version;
        s >> version;
        if (m_supported_versions.find(version) == m_supported_versions.end()) {
            throw std::ios_base::failure(strprintf("Version of snapshot %s does not match any of the supported versions.", version));
        }

        // Read the network magic (pchMessageStart)
        MessageStartChars message;
        s >> message;
        if (!std::equal(message.begin(), message.end(), m_network_magic.data())) {
            auto metadata_network{GetNetworkForMagic(message)};
            if (metadata_network) {
                std::string network_string{ChainTypeToString(metadata_network.value())};
                auto node_network{GetNetworkForMagic(m_network_magic)};
                std::string node_network_string{ChainTypeToString(node_network.value())};
                throw std::ios_base::failure(strprintf("The network of the snapshot (%s) does not match the network of this node (%s).", network_string, node_network_string));
            } else {
                throw std::ios_base::failure("This snapshot has been created for an unrecognized network. This could be a custom signet, a new testnet or possibly caused by data corruption.");
            }
        }

        s >> m_base_blockhash;
        s >> m_coins_count;
    }